

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generic.cc
# Opt level: O2

ssize_t avro::GenericWriter::write(int __fd,void *__buf,size_t __n)

{
  pointer ppVar1;
  pointer pGVar2;
  int iVar3;
  size_t sVar4;
  GenericUnion *pGVar5;
  float *pfVar6;
  GenericMap *pGVar7;
  long lVar8;
  ssize_t sVar9;
  GenericFixed *pGVar10;
  ssize_t extraout_RAX;
  GenericRecord *pGVar11;
  undefined4 extraout_var;
  ssize_t sVar12;
  bool *pbVar13;
  double *pdVar14;
  GenericEnum *pGVar15;
  uint *puVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  size_t *psVar18;
  code *UNRECOVERED_JUMPTABLE;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  ssize_t extraout_RAX_00;
  GenericArray *pGVar19;
  Exception *this;
  string *x;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  size_t __n_00;
  size_t extraout_RDX;
  size_t __n_01;
  size_t extraout_RDX_00;
  size_t __n_02;
  uint uVar20;
  undefined4 in_register_0000003c;
  GenericDatum *this_00;
  pointer ppVar21;
  pointer pGVar22;
  bool bVar23;
  double dVar24;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  
  this_00 = (GenericDatum *)CONCAT44(in_register_0000003c,__fd);
LAB_0016f86a:
  switch(this_00->type_) {
  case AVRO_STRING:
    pbVar17 = boost::any_cast<std::__cxx11::string>(&this_00->value_);
    sVar9 = (**(code **)(*__buf + 0x50))(__buf,pbVar17);
    return sVar9;
  case AVRO_BYTES:
    bytes = boost::any_cast<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      (&this_00->value_);
    Encoder::encodeBytes((Encoder *)__buf,bytes);
    return extraout_RAX_00;
  case AVRO_INT:
    puVar16 = (uint *)boost::any_cast<int>(&this_00->value_);
    uVar20 = *puVar16;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x30);
    break;
  case AVRO_LONG:
    psVar18 = (size_t *)boost::any_cast<long>(&this_00->value_);
    sVar4 = *psVar18;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x38);
    goto LAB_0016faa6;
  case AVRO_FLOAT:
    pfVar6 = boost::any_cast<float>(&this_00->value_);
    dVar24 = (double)(ulong)(uint)*pfVar6;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x40);
    goto LAB_0016fa10;
  case AVRO_DOUBLE:
    pdVar14 = boost::any_cast<double>(&this_00->value_);
    dVar24 = *pdVar14;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x48);
LAB_0016fa10:
    sVar9 = (*UNRECOVERED_JUMPTABLE)(dVar24,__buf);
    return sVar9;
  case AVRO_BOOL:
    pbVar13 = boost::any_cast<bool>(&this_00->value_);
    uVar20 = (uint)*pbVar13;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x28);
    break;
  case AVRO_NULL:
    sVar9 = (**(code **)(*__buf + 0x20))(__buf);
    return sVar9;
  case AVRO_RECORD:
    pGVar11 = boost::any_cast<avro::GenericRecord>(&this_00->value_);
    iVar3 = (*((pGVar11->super_GenericContainer).schema_.px)->_vptr_Node[4])();
    sVar12 = CONCAT44(extraout_var,iVar3);
    iVar3 = 0;
    __n_01 = extraout_RDX;
    sVar9 = sVar12;
    while (bVar23 = sVar9 != 0, sVar9 = sVar9 + -1, bVar23) {
      sVar12 = write((int)(pGVar11->fields_).
                          super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar3,__buf,__n_01);
      iVar3 = iVar3 + 0x10;
      __n_01 = extraout_RDX_00;
    }
    return sVar12;
  case AVRO_ENUM:
    pGVar15 = boost::any_cast<avro::GenericEnum>(&this_00->value_);
    sVar4 = pGVar15->value_;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x68);
LAB_0016faa6:
    sVar9 = (*UNRECOVERED_JUMPTABLE)(__buf,sVar4);
    return sVar9;
  case AVRO_ARRAY:
    pGVar19 = boost::any_cast<avro::GenericArray>(&this_00->value_);
    (**(code **)(*__buf + 0x70))(__buf);
    pGVar22 = (pGVar19->value_).
              super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
              super__Vector_impl_data._M_start;
    pGVar2 = (pGVar19->value_).
             super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pGVar22 != pGVar2) {
      (**(code **)(*__buf + 0x90))(__buf,(long)pGVar2 - (long)pGVar22 >> 4);
      for (pGVar22 = (pGVar19->value_).
                     super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pGVar22 !=
          (pGVar19->value_).
          super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
          super__Vector_impl_data._M_finish; pGVar22 = pGVar22 + 1) {
        (**(code **)(*__buf + 0x98))(__buf);
        write((int)pGVar22,__buf,__n_02);
      }
    }
    sVar9 = (**(code **)(*__buf + 0x78))(__buf);
    return sVar9;
  case AVRO_MAP:
    pGVar7 = boost::any_cast<avro::GenericMap>(&this_00->value_);
    (**(code **)(*__buf + 0x80))(__buf);
    ppVar21 = (pGVar7->value_).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (pGVar7->value_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar21 != ppVar1) {
      lVar8 = (long)ppVar1 - (long)ppVar21;
      (**(code **)(*__buf + 0x90))(__buf,lVar8 / 0x30,lVar8 % 0x30);
      for (ppVar21 = (pGVar7->value_).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVar21 !=
          (pGVar7->value_).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppVar21 = ppVar21 + 1) {
        (**(code **)(*__buf + 0x98))(__buf);
        (**(code **)(*__buf + 0x50))(__buf,ppVar21);
        write((int)ppVar21 + 0x20,__buf,__n_00);
      }
    }
    sVar9 = (**(code **)(*__buf + 0x88))(__buf);
    return sVar9;
  case AVRO_UNION:
    goto switchD_0016f87e_caseD_c;
  case AVRO_FIXED:
    pGVar10 = boost::any_cast<avro::GenericFixed>(&this_00->value_);
    Encoder::encodeFixed((Encoder *)__buf,&pGVar10->value_);
    return extraout_RAX;
  default:
    this = (Exception *)__cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (&bStack_108,"Unknown schema type %1%");
    x = toString_abi_cxx11_(this_00->type_);
    msg = boost::io::detail::
          feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                    (&bStack_108,x);
    Exception::Exception(this,msg);
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  }
  sVar9 = (*UNRECOVERED_JUMPTABLE)(__buf,uVar20);
  return sVar9;
switchD_0016f87e_caseD_c:
  sVar4 = GenericDatum::unionBranch(this_00);
  (**(code **)(*__buf + 0xa0))(__buf,sVar4);
  pGVar5 = boost::any_cast<avro::GenericUnion>(&this_00->value_);
  this_00 = &pGVar5->datum_;
  goto LAB_0016f86a;
}

Assistant:

void GenericWriter::write(const GenericDatum& datum, Encoder& e)
{
    if (datum.isUnion()) {
        e.encodeUnionIndex(datum.unionBranch());
        write(datum.value<GenericUnion>().datum(), e);
        return;
    }
    switch (datum.type()) {
    case AVRO_NULL:
        e.encodeNull();
        break;
    case AVRO_BOOL:
        e.encodeBool(datum.value<bool>());
        break;
    case AVRO_INT:
        e.encodeInt(datum.value<int32_t>());
        break;
    case AVRO_LONG:
        e.encodeLong(datum.value<int64_t>());
        break;
    case AVRO_FLOAT:
        e.encodeFloat(datum.value<float>());
        break;
    case AVRO_DOUBLE:
        e.encodeDouble(datum.value<double>());
        break;
    case AVRO_STRING:
        e.encodeString(datum.value<string>());
        break;
    case AVRO_BYTES:
        e.encodeBytes(datum.value<bytes>());
        break;
    case AVRO_FIXED:
        e.encodeFixed(datum.value<GenericFixed>().value());
        break;
    case AVRO_RECORD:
        {
            const GenericRecord& r = datum.value<GenericRecord>();
            size_t c = r.schema()->leaves();
            for (size_t i = 0; i < c; ++i) {
                write(r.fieldAt(i), e);
            }
        }
        break;
    case AVRO_ENUM:
        e.encodeEnum(datum.value<GenericEnum>().value());
        break;
    case AVRO_ARRAY:
        {
            const GenericArray::Value& r = datum.value<GenericArray>().value();
            e.arrayStart();
            if (! r.empty()) {
                e.setItemCount(r.size());
                for (GenericArray::Value::const_iterator it = r.begin();
                    it != r.end(); ++it) {
                    e.startItem();
                    write(*it, e);
                }
            }
            e.arrayEnd();
        }
        break;
    case AVRO_MAP:
        {
            const GenericMap::Value& r = datum.value<GenericMap>().value();
            e.mapStart();
            if (! r.empty()) {
                e.setItemCount(r.size());
                for (GenericMap::Value::const_iterator it = r.begin();
                    it != r.end(); ++it) {
                    e.startItem();
                    e.encodeString(it->first);
                    write(it->second, e);
                }
            }
            e.mapEnd();
        }
        break;
    default:
        throw Exception(boost::format("Unknown schema type %1%") %
            toString(datum.type()));
    }
}